

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O1

void Bmc_CexTest(Gia_Man_t *p,Abc_Cex_t *pCex,int fVerbose)

{
  int iVar1;
  long lVar2;
  int level;
  long lVar3;
  Abc_Cex_t *pCexStates;
  Abc_Cex_t *pCexCare;
  Abc_Cex_t *pCexImpl;
  timespec ts;
  Abc_Cex_t *pCexMin;
  Abc_Cex_t *pCexEss;
  Abc_Cex_t *local_60;
  Abc_Cex_t *local_58;
  Abc_Cex_t *local_50;
  timespec local_48;
  Abc_Cex_t *local_38;
  Abc_Cex_t *local_30;
  
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  local_50 = (Abc_Cex_t *)0x0;
  local_60 = Bmc_CexInnerStates(p,pCex,&local_50,fVerbose);
  local_58 = Bmc_CexCareBits(p,local_60,local_50,(Abc_Cex_t *)0x0,1,fVerbose);
  iVar1 = Bmc_CexVerify(p,pCex,local_58);
  if (iVar1 == 0) {
    puts("Counter-example care-set verification has failed.");
  }
  local_30 = Bmc_CexEssentialBits(p,local_60,local_58,fVerbose);
  local_38 = Bmc_CexCareBits(p,local_60,local_50,local_30,0,fVerbose);
  iVar1 = Bmc_CexVerify(p,pCex,local_38);
  if (iVar1 == 0) {
    puts("Counter-example min-set verification has failed.");
  }
  Abc_CexFreeP(&local_60);
  Abc_CexFreeP(&local_50);
  Abc_CexFreeP(&local_58);
  Abc_CexFreeP(&local_30);
  Abc_CexFreeP(&local_38);
  level = 3;
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
  return;
}

Assistant:

void Bmc_CexTest( Gia_Man_t * p, Abc_Cex_t * pCex, int fVerbose )
{
    abctime clk = Abc_Clock();
    Abc_Cex_t * pCexImpl   = NULL;
    Abc_Cex_t * pCexStates = Bmc_CexInnerStates( p, pCex, &pCexImpl, fVerbose );
    Abc_Cex_t * pCexCare   = Bmc_CexCareBits( p, pCexStates, pCexImpl, NULL, 1, fVerbose );
    Abc_Cex_t * pCexEss, * pCexMin;

    if ( !Bmc_CexVerify( p, pCex, pCexCare ) )
        printf( "Counter-example care-set verification has failed.\n" );

    pCexEss = Bmc_CexEssentialBits( p, pCexStates, pCexCare, fVerbose );
    pCexMin = Bmc_CexCareBits( p, pCexStates, pCexImpl, pCexEss, 0, fVerbose );

    if ( !Bmc_CexVerify( p, pCex, pCexMin ) )
        printf( "Counter-example min-set verification has failed.\n" );

//    Bmc_CexDumpStats( p, pCex, pCexCare, pCexEss, pCexMin, Abc_Clock() - clk );

    Abc_CexFreeP( &pCexStates );
    Abc_CexFreeP( &pCexImpl );
    Abc_CexFreeP( &pCexCare );
    Abc_CexFreeP( &pCexEss );
    Abc_CexFreeP( &pCexMin );

    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    Bmc_CexBuildNetworkTest( p, pCex );
//    Bmc_CexPerformUnrollingTest( p, pCex );
}